

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_DeadReckoningParameter *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LE_DeadReckoningParameter *local_18;
  LE_DeadReckoningParameter *this_local;
  
  local_18 = this;
  this_local = (LE_DeadReckoningParameter *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"LE Dead Reckoning Parameters:\n");
  poVar1 = std::operator<<(poVar1,"\tAlgorithm:          ");
  ENUMS::GetEnumAsStringDeadReckoningAlgorithm_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8DeadRecknoningAlgorithm,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tLinear Acceleration: ");
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_1f0,&this->m_LinearAcceleration);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tAngular Velocity:    ");
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_210,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_DeadReckoningParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LE Dead Reckoning Parameters:\n"
       << "\tAlgorithm:          "   << GetEnumAsStringDeadReckoningAlgorithm( m_ui8DeadRecknoningAlgorithm )
       << "\n\tLinear Acceleration: " << m_LinearAcceleration.GetAsString()
       << "\tAngular Velocity:    "   << m_AngularVelocity.GetAsString();

    return ss.str();
}